

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::f_fmin(Forth *this)

{
  ForthStack<double> *this_00;
  double Value;
  double dVar1;
  
  requireFStackDepth(this,2,"FMIN");
  this_00 = &this->fStack;
  Value = ForthStack<double>::getTop(this_00,0);
  ForthStack<double>::pop(this_00);
  dVar1 = ForthStack<double>::getTop(this_00,0);
  if (Value < dVar1) {
    ForthStack<double>::setTop(this_00,Value);
    return;
  }
  return;
}

Assistant:

void f_fmin() {
			REQUIRE_FSTACK_DEPTH(2, "FMIN");
			auto r1 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0);
			if (r1 < r2){
				fStack.setTop(r1);
			}
		}